

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolverAPI.c
# Opt level: O1

int xSAT_SolverSimplify(xSAT_Solver_t *s)

{
  iword *piVar1;
  xSAT_Watcher_t *pxVar2;
  uint uVar3;
  uint *puVar4;
  xSAT_VecWatchList_t *pxVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  Vec_Int_t *pVVar9;
  xSAT_Watcher_t *pxVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  xSAT_WatchList_t *pxVar14;
  uint uVar15;
  long lVar16;
  
  if (s->vTrailLim->nSize != 0) {
    __assert_fail("xSAT_SolverDecisionLevel(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatSolverAPI.c"
                  ,0xa8,"int xSAT_SolverSimplify(xSAT_Solver_t *)");
  }
  uVar6 = xSAT_SolverPropagate(s);
  iVar7 = 0;
  if (((uVar6 == 0xffffffff) && (iVar7 = 1, s->nAssignSimplify != s->vTrail->nSize)) &&
     (s->nPropSimplify < 1)) {
    pVVar9 = s->vClauses;
    uVar6 = pVVar9->nSize;
    uVar8 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar15 = 0;
    }
    else {
      lVar16 = 0;
      uVar15 = 0;
      do {
        uVar6 = pVVar9->pArray[lVar16];
        puVar4 = s->pMemory->pData;
        uVar3 = puVar4[(long)(int)uVar6 + 1];
        lVar11 = (long)(int)uVar3;
        if (0 < lVar11) {
          puVar4 = puVar4 + (int)uVar6;
          lVar12 = 0;
LAB_00552ba9:
          uVar13 = (int)puVar4[lVar12 + 2] >> 1;
          if (((int)uVar13 < 0) || (s->vAssigns->nSize <= (int)uVar13)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if ((puVar4[lVar12 + 2] & 1) != (int)s->vAssigns->pArray[uVar13]) goto code_r0x00552bd9;
          *(byte *)puVar4 = (byte)*puVar4 | 2;
          piVar1 = &(s->Stats).nClauseLits;
          *piVar1 = *piVar1 - lVar11;
          uVar8 = (long)(int)puVar4[2] ^ 1;
          iVar7 = (int)uVar8;
          if (uVar3 == 2) {
            pxVar5 = s->vBinWatches;
            if (pxVar5->nCap <= iVar7) goto LAB_00552e87;
            if (pxVar5->nSize <= iVar7) goto LAB_00552e68;
            pxVar14 = pxVar5->pArray;
            pxVar10 = pxVar14[uVar8].pArray;
            lVar11 = 0;
            do {
              lVar12 = lVar11;
              lVar11 = lVar12 + 1;
            } while (pxVar10[lVar12].CRef != uVar6);
            if (pxVar14[uVar8].nSize <= (int)lVar12) goto LAB_00552e49;
            memmove(pxVar10 + lVar12,pxVar10 + lVar11,
                    (long)(pxVar14[uVar8].nSize - (int)lVar11) << 3);
            pxVar14[uVar8].nSize = pxVar14[uVar8].nSize + -1;
            pxVar5 = s->vBinWatches;
            uVar8 = (long)(int)puVar4[3] ^ 1;
            if (pxVar5->nCap <= (int)uVar8) {
LAB_00552e87:
              __assert_fail("iEntry < v->nCap",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatWatchList.h"
                            ,0x106,
                            "xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)");
            }
            if (pxVar5->nSize <= (int)uVar8) {
LAB_00552e68:
              __assert_fail("iEntry < v->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatWatchList.h"
                            ,0x107,
                            "xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)");
            }
            pxVar14 = pxVar5->pArray + uVar8;
            pxVar10 = pxVar5->pArray[uVar8].pArray;
            lVar11 = 0;
            do {
              lVar12 = lVar11 + 1;
              pxVar2 = pxVar10 + lVar11;
              lVar11 = lVar12;
            } while (pxVar2->CRef != uVar6);
          }
          else {
            pxVar5 = s->vWatches;
            if (pxVar5->nCap <= iVar7) goto LAB_00552e87;
            if (pxVar5->nSize <= iVar7) goto LAB_00552e68;
            pxVar14 = pxVar5->pArray;
            pxVar10 = pxVar14[iVar7].pArray;
            lVar11 = 0;
            do {
              lVar12 = lVar11;
              lVar11 = lVar12 + 1;
            } while (pxVar10[lVar12].CRef != uVar6);
            if (pxVar14[iVar7].nSize <= (int)lVar12) goto LAB_00552e49;
            memmove(pxVar10 + lVar12,pxVar10 + lVar11,
                    (long)(pxVar14[iVar7].nSize - (int)lVar11) << 3);
            pxVar14[iVar7].nSize = pxVar14[iVar7].nSize + -1;
            pxVar5 = s->vWatches;
            uVar8 = (long)(int)puVar4[3] ^ 1;
            if (pxVar5->nCap <= (int)uVar8) goto LAB_00552e87;
            if (pxVar5->nSize <= (int)uVar8) goto LAB_00552e68;
            pxVar14 = pxVar5->pArray + uVar8;
            pxVar10 = pxVar5->pArray[uVar8].pArray;
            lVar11 = 0;
            do {
              lVar12 = lVar11 + 1;
              pxVar2 = pxVar10 + lVar11;
              lVar11 = lVar12;
            } while (pxVar2->CRef != uVar6);
          }
          if (pxVar14->nSize <= (int)lVar12 + -1) {
LAB_00552e49:
            __assert_fail("j < xSAT_WatchListSize( v )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatWatchList.h"
                          ,0xab,"void xSAT_WatchListRemove(xSAT_WatchList_t *, unsigned int)");
          }
          memmove(pxVar10 + lVar12 + -1,pxVar10 + lVar12,(long)(pxVar14->nSize - (int)lVar12) << 3);
          pxVar14->nSize = pxVar14->nSize + -1;
          goto LAB_00552d89;
        }
LAB_00552be1:
        if (((int)uVar15 < 0) || ((int)uVar8 <= (int)uVar15)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar8 = (ulong)uVar15;
        uVar15 = uVar15 + 1;
        pVVar9->pArray[uVar8] = uVar6;
LAB_00552d89:
        lVar16 = lVar16 + 1;
        pVVar9 = s->vClauses;
        uVar6 = pVVar9->nSize;
        uVar8 = (ulong)(int)uVar6;
      } while (lVar16 < (long)uVar8);
    }
    if ((int)uVar6 < (int)uVar15) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    pVVar9->nSize = uVar15;
    xSAT_SolverRebuildOrderHeap(s);
    lVar16 = (s->Stats).nLearntLits;
    s->nAssignSimplify = s->vTrail->nSize;
    s->nPropSimplify = lVar16 + (s->Stats).nClauseLits;
    iVar7 = 1;
  }
  return iVar7;
code_r0x00552bd9:
  lVar12 = lVar12 + 1;
  if (lVar11 == lVar12) goto LAB_00552be1;
  goto LAB_00552ba9;
}

Assistant:

int xSAT_SolverSimplify( xSAT_Solver_t * s )
{
    int i, j;
    unsigned CRef;
    assert( xSAT_SolverDecisionLevel(s) == 0 );

    if ( xSAT_SolverPropagate(s) != CRefUndef )
        return false;

    if ( s->nAssignSimplify == Vec_IntSize( s->vTrail ) || s->nPropSimplify > 0 )
        return true;

    j = 0;
    Vec_IntForEachEntry( s->vClauses, CRef, i )
    {
        xSAT_Clause_t * pCla = xSAT_SolverReadClause( s, CRef );
        if ( xSAT_SolverIsClauseSatisfied( s, pCla ) )
        {
            pCla->fMark = 1;
            s->Stats.nClauseLits -= pCla->nSize;

            if ( pCla->nSize == 2 )
            {
                xSAT_WatchListRemove( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit(pCla->pData[0].Lit) ), CRef );
                xSAT_WatchListRemove( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit(pCla->pData[1].Lit) ), CRef );
            }
            else
            {
                xSAT_WatchListRemove( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit(pCla->pData[0].Lit) ), CRef );
                xSAT_WatchListRemove( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit(pCla->pData[1].Lit) ), CRef );
            }
        }
        else
            Vec_IntWriteEntry( s->vClauses, j++, CRef );
    }
    Vec_IntShrink( s->vClauses, j );
    xSAT_SolverRebuildOrderHeap( s );

    s->nAssignSimplify = Vec_IntSize( s->vTrail );
    s->nPropSimplify = s->Stats.nClauseLits + s->Stats.nLearntLits;

    return true;
}